

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

bool __thiscall
ON_DimStyle::Internal_SetBoolMember(ON_DimStyle *this,field field_id,bool value,bool *class_member)

{
  bool bVar1;
  
  bVar1 = *class_member;
  if (bVar1 != value) {
    *class_member = value;
    Internal_ContentChange(this);
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,field_id);
  return bVar1 != value;
}

Assistant:

bool ON_DimStyle::Internal_SetBoolMember(
  ON_DimStyle::field field_id,
  bool value,
  bool& class_member
)
{
  bool bValueChanged = false;
  const bool b = value ? true : false;
  if (b != class_member)
  {
    class_member = b;
    Internal_ContentChange();
    bValueChanged = true;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(field_id);
  return bValueChanged;
}